

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O2

void yaml_emitter_set_output_string
               (yaml_emitter_t *emitter,uchar *output,size_t size,size_t *size_written)

{
  if (emitter == (yaml_emitter_t *)0x0) {
    __assert_fail("emitter",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x1cc,
                  "void yaml_emitter_set_output_string(yaml_emitter_t *, unsigned char *, size_t, size_t *)"
                 );
  }
  if (emitter->write_handler == (yaml_write_handler_t *)0x0) {
    if (output != (uchar *)0x0) {
      emitter->write_handler = yaml_string_write_handler;
      emitter->write_handler_data = emitter;
      (emitter->output).string.buffer = output;
      (emitter->output).string.size = size;
      (emitter->output).string.size_written = size_written;
      *size_written = 0;
      return;
    }
    __assert_fail("output",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x1ce,
                  "void yaml_emitter_set_output_string(yaml_emitter_t *, unsigned char *, size_t, size_t *)"
                 );
  }
  __assert_fail("!emitter->write_handler",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                ,0x1cd,
                "void yaml_emitter_set_output_string(yaml_emitter_t *, unsigned char *, size_t, size_t *)"
               );
}

Assistant:

YAML_DECLARE(void)
yaml_emitter_set_output_string(yaml_emitter_t *emitter,
        unsigned char *output, size_t size, size_t *size_written)
{
    assert(emitter);    /* Non-NULL emitter object expected. */
    assert(!emitter->write_handler);    /* You can set the output only once. */
    assert(output);     /* Non-NULL output string expected. */

    emitter->write_handler = yaml_string_write_handler;
    emitter->write_handler_data = emitter;

    emitter->output.string.buffer = output;
    emitter->output.string.size = size;
    emitter->output.string.size_written = size_written;
    *size_written = 0;
}